

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O1

void e_died(entity *etmp,int dest,int how)

{
  entity *peVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  coord xy;
  coord local_a;
  
  if (etmp->emon == &youmonst) {
    if (how == 5) {
      killer = (char *)0x0;
      lava_effects();
    }
    else if (how == 4) {
      killer = (char *)0x0;
      drown();
    }
    else {
      if (killer == (char *)0x0) {
        killer_format = 0;
        killer = "falling drawbridge";
      }
      done(how);
      bVar2 = e_survives_at(etmp,etmp->ex,etmp->ey);
      if ((bVar2 == '\0') &&
         (bVar2 = enexto(&local_a,level,(xchar)etmp->ex,(xchar)etmp->ey,etmp->edata), bVar2 != '\0')
         ) {
        pcVar4 = "strange";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar4 = "normal";
          }
          else {
            bVar2 = dmgtype(youmonst.data,0x24);
            pcVar4 = "strange";
            if (bVar2 == '\0') {
              pcVar4 = "normal";
            }
          }
        }
        pline("A %s force teleports you away...",pcVar4);
        teleds((int)local_a.x,(int)local_a.y,'\0');
      }
    }
    etmp->ex = (int)u.ux;
    etmp->ey = (int)u.uy;
  }
  else {
    killer = (char *)0x0;
    if (flags.mon_moving == '\0') {
      xkilled(etmp->emon,dest);
    }
    else {
      pcVar4 = (char *)0x0;
      if ((dest & 1U) != 0) {
        pcVar4 = "";
      }
      monkilled(etmp->emon,pcVar4,(dest << 0x1e) >> 0x1f & 0x1a);
    }
    etmp->edata = (permonst *)0x0;
    lVar3 = 0;
    do {
      peVar1 = (entity *)((long)&occupants[0].emon + lVar3);
      if ((peVar1 != etmp) && (etmp->emon == peVar1->emon)) {
        *(undefined8 *)((long)&occupants[0].edata + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 == 0x18);
  }
  return;
}

Assistant:

static void e_died(struct entity *etmp, int dest, int how)
{
	if (is_u(etmp)) {
		if (how == DROWNING) {
			killer = 0;	/* drown() sets its own killer */
			drown();
		} else if (how == BURNING) {
			killer = 0;	/* lava_effects() sets its own killer */
			lava_effects();
		} else {
			coord xy;

			/* use more specific killer if specified */
			if (!killer) {
			    killer_format = KILLED_BY_AN;
			    killer = "falling drawbridge";
			}
			done(how);
			/* So, you didn't die */
			if (!e_survives_at(etmp, etmp->ex, etmp->ey)) {
			    if (enexto(&xy, level, etmp->ex, etmp->ey, etmp->edata)) {
				pline("A %s force teleports you away...",
				      Hallucination ? "normal" : "strange");
				teleds(xy.x, xy.y, FALSE);
			    }
			    /* otherwise on top of the drawbridge is the
			     * only viable spot in the dungeon, so stay there
			     */
			}
		}
		/* we might have crawled out of the moat to survive */
		etmp->ex = u.ux,  etmp->ey = u.uy;
	} else {
		int entitycnt;

		killer = 0;
		/* fake "digested to death" damage-type suppresses corpse */
#define mk_message(dest) ((dest & 1) ? "" : NULL)
#define mk_corpse(dest)  ((dest & 2) ? AD_DGST : AD_PHYS)
		/* if monsters are moving, one of them caused the destruction */
		if (flags.mon_moving)
		    monkilled(etmp->emon, mk_message(dest), mk_corpse(dest));
		else		/* you caused it */
		    xkilled(etmp->emon, dest);
		etmp->edata = NULL;

		/* dead long worm handling */
		for (entitycnt = 0; entitycnt < ENTITIES; entitycnt++) {
		    if (etmp != &(occupants[entitycnt]) &&
			etmp->emon == occupants[entitycnt].emon)
			occupants[entitycnt].edata = NULL;
		}
#undef mk_message
#undef mk_corpse
	}
}